

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3ScratchMalloc(int n)

{
  long lVar1;
  bool bVar2;
  ScratchFreeslot *pSVar3;
  int iVar4;
  ScratchFreeslot *pSVar5;
  u64 n_00;
  
  if (mem0.mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
  }
  n_00 = (u64)n;
  if (sqlite3Stat.mxValue[8] < (long)n_00) {
    sqlite3Stat.mxValue[8] = n_00;
  }
  if ((mem0.nScratchFree == 0) || (sqlite3Config.szScratch < n)) {
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
    }
    pSVar5 = (ScratchFreeslot *)sqlite3Malloc(n_00);
    if (pSVar5 == (ScratchFreeslot *)0x0 || sqlite3Config.bMemstat == 0) {
      return pSVar5;
    }
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
    }
    iVar4 = (*sqlite3Config.m.xSize)(pSVar5);
    sqlite3Stat.nowValue[4] = iVar4 + sqlite3Stat.nowValue[4];
    pSVar3 = mem0.pScratchFree;
    if (sqlite3Stat.mxValue[4] < sqlite3Stat.nowValue[4]) {
      sqlite3Stat.mxValue[4] = sqlite3Stat.nowValue[4];
    }
  }
  else {
    mem0.nScratchFree = mem0.nScratchFree - 1;
    lVar1 = sqlite3Stat.nowValue[3] + 1;
    bVar2 = sqlite3Stat.mxValue[3] <= sqlite3Stat.nowValue[3];
    pSVar5 = mem0.pScratchFree;
    sqlite3Stat.nowValue[3] = lVar1;
    pSVar3 = (mem0.pScratchFree)->pNext;
    if (bVar2) {
      sqlite3Stat.mxValue[3] = lVar1;
    }
  }
  mem0.pScratchFree = pSVar3;
  if (mem0.mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
  }
  return pSVar5;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ScratchMalloc(int n){
  void *p;
  assert( n>0 );

  sqlite3_mutex_enter(mem0.mutex);
  sqlite3StatusHighwater(SQLITE_STATUS_SCRATCH_SIZE, n);
  if( mem0.nScratchFree && sqlite3GlobalConfig.szScratch>=n ){
    p = mem0.pScratchFree;
    mem0.pScratchFree = mem0.pScratchFree->pNext;
    mem0.nScratchFree--;
    sqlite3StatusUp(SQLITE_STATUS_SCRATCH_USED, 1);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    sqlite3_mutex_leave(mem0.mutex);
    p = sqlite3Malloc(n);
    if( sqlite3GlobalConfig.bMemstat && p ){
      sqlite3_mutex_enter(mem0.mutex);
      sqlite3StatusUp(SQLITE_STATUS_SCRATCH_OVERFLOW, sqlite3MallocSize(p));
      sqlite3_mutex_leave(mem0.mutex);
    }
    sqlite3MemdebugSetType(p, MEMTYPE_SCRATCH);
  }
  assert( sqlite3_mutex_notheld(mem0.mutex) );


#if SQLITE_THREADSAFE==0 && !defined(NDEBUG)
  /* EVIDENCE-OF: R-12970-05880 SQLite will not use more than one scratch
  ** buffers per thread.
  **
  ** This can only be checked in single-threaded mode.
  */
  assert( scratchAllocOut==0 );
  if( p ) scratchAllocOut++;
#endif

  return p;
}